

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_compile.cpp
# Opt level: O2

ZCC_Expression * __thiscall
ZCCCompiler::NodeFromSymbol
          (ZCCCompiler *this,PSymbol *sym,ZCC_Expression *source,PSymbolTable *table)

{
  PSymbolTable *pPVar1;
  PClass *pPVar2;
  bool bVar3;
  PClass *pPVar4;
  ZCC_ExprConstant *pZVar5;
  ZCC_ExprTypeRef *pZVar6;
  
  pPVar2 = PSymbolTreeNode::RegistrationInfo.MyClass;
  if (sym == (PSymbol *)0x0) {
    __assert_fail("sym != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/zcc_compile.cpp"
                  ,0x232,
                  "ZCC_Expression *ZCCCompiler::NodeFromSymbol(PSymbol *, ZCC_Expression *, PSymbolTable *)"
                 );
  }
  pPVar4 = DObject::GetClass(&sym->super_DObject);
  if (pPVar4 == pPVar2) {
    pPVar1 = this->Symbols;
    this->Symbols = table;
    sym = CompileNode(this,(ZCC_NamedNode *)sym[1].super_DObject._vptr_DObject);
    this->Symbols = pPVar1;
    if ((PSymbolType *)sym == (PSymbolType *)0x0) {
      return (ZCC_Expression *)0x0;
    }
  }
  bVar3 = DObject::IsKindOf(&sym->super_DObject,PSymbolConst::RegistrationInfo.MyClass);
  if (!bVar3) {
    bVar3 = DObject::IsKindOf(&sym->super_DObject,PSymbolType::RegistrationInfo.MyClass);
    if (!bVar3) {
      return (ZCC_Expression *)0x0;
    }
    pZVar6 = NodeFromSymbolType(this,(PSymbolType *)sym,source);
    return &pZVar6->super_ZCC_Expression;
  }
  pZVar5 = NodeFromSymbolConst(this,(PSymbolConst *)sym,source);
  return &pZVar5->super_ZCC_Expression;
}

Assistant:

ZCC_Expression *ZCCCompiler::NodeFromSymbol(PSymbol *sym, ZCC_Expression *source, PSymbolTable *table)
{
	assert(sym != NULL);
	if (sym->IsA(RUNTIME_CLASS(PSymbolTreeNode)))
	{
		PSymbolTable *prevtable = Symbols;
		Symbols = table;
		sym = CompileNode(static_cast<PSymbolTreeNode *>(sym)->Node);
		Symbols = prevtable;
		if (sym == NULL)
		{
			return NULL;
		}
	}
	if (sym->IsKindOf(RUNTIME_CLASS(PSymbolConst)))
	{
		return NodeFromSymbolConst(static_cast<PSymbolConst *>(sym), source);
	}
	else if (sym->IsKindOf(RUNTIME_CLASS(PSymbolType)))
	{
		return NodeFromSymbolType(static_cast<PSymbolType *>(sym), source);
	}
	return NULL;
}